

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CheckRPath(string *file,string *newRPath)

{
  char *fname;
  ulong uVar1;
  size_type sVar2;
  StringEntry *local_50;
  StringEntry *se;
  cmELF elf;
  string *newRPath_local;
  string *file_local;
  
  elf.ErrorMessage.field_2._8_8_ = newRPath;
  fname = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)&se,fname);
  local_50 = cmELF::GetRPath((cmELF *)&se);
  if (local_50 == (StringEntry *)0x0) {
    local_50 = cmELF::GetRunPath((cmELF *)&se);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    if ((local_50 != (StringEntry *)0x0) &&
       (sVar2 = cmSystemToolsFindRPath(&local_50->Value,elf.ErrorMessage.field_2._8_8_),
       sVar2 != 0xffffffffffffffff)) {
      file_local._7_1_ = true;
      goto LAB_0035a380;
    }
  }
  else if (local_50 == (StringEntry *)0x0) {
    file_local._7_1_ = true;
    goto LAB_0035a380;
  }
  file_local._7_1_ = false;
LAB_0035a380:
  cmELF::~cmELF((cmELF *)&se);
  return file_local._7_1_;
}

Assistant:

bool cmSystemTools::CheckRPath(std::string const& file,
                               std::string const& newRPath)
{
#if defined(CMAKE_USE_ELF_PARSER)
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH or RUNPATH entry from it.
  cmELF::StringEntry const* se = elf.GetRPath();
  if (!se) {
    se = elf.GetRunPath();
  }

  // Make sure the current rpath contains the new rpath.
  if (newRPath.empty()) {
    if (!se) {
      return true;
    }
  } else {
    if (se &&
        cmSystemToolsFindRPath(se->Value, newRPath) != std::string::npos) {
      return true;
    }
  }
  return false;
#else
  (void)file;
  (void)newRPath;
  return false;
#endif
}